

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

CURLcode load_cacert_from_memory(SSL_CTX *ctx,curl_blob *ca_info_blob)

{
  int iVar1;
  int iVar2;
  X509_STORE *ctx_00;
  BIO *bp;
  stack_st_X509_INFO *psVar3;
  undefined8 *puVar4;
  CURLcode CVar5;
  int iVar6;
  
  CVar5 = CURLE_SSL_CACERT_BADFILE;
  if (ca_info_blob->len < 0x80000000) {
    ctx_00 = SSL_CTX_get_cert_store((SSL_CTX *)ctx);
    CVar5 = CURLE_OUT_OF_MEMORY;
    if ((ctx_00 != (X509_STORE *)0x0) &&
       (bp = BIO_new_mem_buf(ca_info_blob->data,(int)ca_info_blob->len), bp != (BIO *)0x0)) {
      psVar3 = PEM_X509_INFO_read_bio(bp,(stack_st_X509_INFO *)0x0,(undefined1 *)0x0,(void *)0x0);
      if (psVar3 == (stack_st_X509_INFO *)0x0) {
        CVar5 = CURLE_SSL_CACERT_BADFILE;
      }
      else {
        iVar1 = OPENSSL_sk_num(psVar3);
        if (iVar1 < 1) {
          CVar5 = CURLE_SSL_CACERT_BADFILE;
        }
        else {
          iVar6 = 0;
          iVar1 = 0;
          do {
            puVar4 = (undefined8 *)OPENSSL_sk_value(psVar3,iVar1);
            if ((X509 *)*puVar4 != (X509 *)0x0) {
              iVar2 = X509_STORE_add_cert(ctx_00,(X509 *)*puVar4);
              if (iVar2 != 0) {
                iVar6 = iVar6 + 1;
                goto LAB_0056a9cf;
              }
LAB_0056aa06:
              iVar6 = 0;
              break;
            }
LAB_0056a9cf:
            if ((X509_CRL *)puVar4[1] != (X509_CRL *)0x0) {
              iVar2 = X509_STORE_add_crl(ctx_00,(X509_CRL *)puVar4[1]);
              if (iVar2 == 0) goto LAB_0056aa06;
              iVar6 = iVar6 + 1;
            }
            iVar1 = iVar1 + 1;
            iVar2 = OPENSSL_sk_num(psVar3);
          } while (iVar1 < iVar2);
          CVar5 = CURLE_SSL_CACERT_BADFILE;
          if (0 < iVar6) {
            CVar5 = CURLE_OK;
          }
        }
        OPENSSL_sk_pop_free(psVar3,X509_INFO_free);
      }
      BIO_free(bp);
    }
  }
  return CVar5;
}

Assistant:

static CURLcode load_cacert_from_memory(SSL_CTX *ctx,
                                        const struct curl_blob *ca_info_blob)
{
  /* these need to be freed at the end */
  BIO *cbio = NULL;
  STACK_OF(X509_INFO) *inf = NULL;

  /* everything else is just a reference */
  int i, count = 0;
  X509_STORE *cts = NULL;
  X509_INFO *itmp = NULL;

  if(ca_info_blob->len > (size_t)INT_MAX)
    return CURLE_SSL_CACERT_BADFILE;

  cts = SSL_CTX_get_cert_store(ctx);
  if(!cts)
    return CURLE_OUT_OF_MEMORY;

  cbio = BIO_new_mem_buf(ca_info_blob->data, (int)ca_info_blob->len);
  if(!cbio)
    return CURLE_OUT_OF_MEMORY;

  inf = PEM_X509_INFO_read_bio(cbio, NULL, NULL, NULL);
  if(!inf) {
    BIO_free(cbio);
    return CURLE_SSL_CACERT_BADFILE;
  }

  /* add each entry from PEM file to x509_store */
  for(i = 0; i < (int)sk_X509_INFO_num(inf); ++i) {
    itmp = sk_X509_INFO_value(inf, i);
    if(itmp->x509) {
      if(X509_STORE_add_cert(cts, itmp->x509)) {
        ++count;
      }
      else {
        /* set count to 0 to return an error */
        count = 0;
        break;
      }
    }
    if(itmp->crl) {
      if(X509_STORE_add_crl(cts, itmp->crl)) {
        ++count;
      }
      else {
        /* set count to 0 to return an error */
        count = 0;
        break;
      }
    }
  }

  sk_X509_INFO_pop_free(inf, X509_INFO_free);
  BIO_free(cbio);

  /* if we didn't end up importing anything, treat that as an error */
  return (count > 0 ? CURLE_OK : CURLE_SSL_CACERT_BADFILE);
}